

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTPPrinter.cpp
# Opt level: O3

void __thiscall
Shell::TPTPPrinter::printWithRole
          (TPTPPrinter *this,string *name,string *role,Unit *u,bool includeSplitLevels)

{
  Unit *u_00;
  ostream *poVar1;
  string body;
  string local_38;
  
  u_00 = (Unit *)name;
  getBodyStr_abi_cxx11_(&local_38,(TPTPPrinter *)name,u,includeSplitLevels);
  ensureHeadersPrinted(this,u_00);
  poVar1 = this->_tgtStream;
  if (poVar1 == (ostream *)0x0) {
    poVar1 = (ostream *)&std::cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"tff(",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(role->_M_dataplus)._M_p,role->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,").",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TPTPPrinter::printWithRole(std::string name, std::string role, Unit* u, bool includeSplitLevels)
{
  std::string body = getBodyStr(u, includeSplitLevels);

  ensureHeadersPrinted(u);
  tgt() << "tff(" << name << ", " << role << ", " << body << ")." << endl;
}